

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O0

RealType __thiscall OpenMD::Bond::getValue(Bond *this,int snap)

{
  undefined4 in_ESI;
  Vector<double,_3U> *in_RDI;
  double dVar1;
  Vector3d *in_stack_00000008;
  Snapshot *in_stack_00000010;
  Vector3d r12;
  Vector<double,_3U> *in_stack_ffffffffffffff90;
  Vector<double,_3U> *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  StuntDouble *in_stack_ffffffffffffffa8;
  
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),1);
  StuntDouble::getPos(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI->data_ + 2),0);
  StuntDouble::getPos(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  OpenMD::operator-(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_ffffffffffffff90,in_RDI);
  (**(code **)(*(long *)in_RDI->data_[1] + 0x20))((long *)in_RDI->data_[1],in_ESI);
  Snapshot::wrapVector(in_stack_00000010,in_stack_00000008);
  dVar1 = Vector<double,_3U>::length((Vector<double,_3U> *)0x1e9993);
  return dVar1;
}

Assistant:

RealType getValue(int snap) {
      Vector3d r12 = atoms_[1]->getPos(snap) - atoms_[0]->getPos(snap);
      snapshotMan_->getSnapshot(snap)->wrapVector(r12);
      return r12.length();
    }